

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_free_data(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_32 mask,int num)

{
  uint local_34;
  int local_30;
  png_uint_32 row;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int num_local;
  png_uint_32 mask_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    if ((info_ptr->text != (png_textp)0x0) && ((mask & 0x4000 & info_ptr->free_me) != 0)) {
      if (num == -1) {
        for (i_2 = 0; i_2 < info_ptr->num_text; i_2 = i_2 + 1) {
          png_free(png_ptr,info_ptr->text[i_2].key);
        }
        png_free(png_ptr,info_ptr->text);
        info_ptr->text = (png_textp)0x0;
        info_ptr->num_text = 0;
        info_ptr->max_text = 0;
      }
      else {
        png_free(png_ptr,info_ptr->text[num].key);
        info_ptr->text[num].key = (png_charp)0x0;
      }
    }
    if ((mask & 0x2000 & info_ptr->free_me) != 0) {
      info_ptr->valid = info_ptr->valid & 0xffffffef;
      png_free(png_ptr,info_ptr->trans_alpha);
      info_ptr->trans_alpha = (png_bytep)0x0;
      info_ptr->num_trans = 0;
    }
    if ((mask & 0x100 & info_ptr->free_me) != 0) {
      png_free(png_ptr,info_ptr->scal_s_width);
      png_free(png_ptr,info_ptr->scal_s_height);
      info_ptr->scal_s_width = (png_charp)0x0;
      info_ptr->scal_s_height = (png_charp)0x0;
      info_ptr->valid = info_ptr->valid & 0xffffbfff;
    }
    if ((mask & 0x80 & info_ptr->free_me) != 0) {
      png_free(png_ptr,info_ptr->pcal_purpose);
      png_free(png_ptr,info_ptr->pcal_units);
      info_ptr->pcal_purpose = (png_charp)0x0;
      info_ptr->pcal_units = (png_charp)0x0;
      if (info_ptr->pcal_params != (png_charpp)0x0) {
        for (i_3 = 0; i_3 < (int)(uint)info_ptr->pcal_nparams; i_3 = i_3 + 1) {
          png_free(png_ptr,info_ptr->pcal_params[i_3]);
        }
        png_free(png_ptr,info_ptr->pcal_params);
        info_ptr->pcal_params = (png_charpp)0x0;
      }
      info_ptr->valid = info_ptr->valid & 0xfffffbff;
    }
    if ((mask & 0x10 & info_ptr->free_me) != 0) {
      png_free(png_ptr,info_ptr->iccp_name);
      png_free(png_ptr,info_ptr->iccp_profile);
      info_ptr->iccp_name = (png_charp)0x0;
      info_ptr->iccp_profile = (png_bytep)0x0;
      info_ptr->valid = info_ptr->valid & 0xffffefff;
    }
    if ((info_ptr->splt_palettes != (png_sPLT_tp)0x0) && ((mask & 0x20 & info_ptr->free_me) != 0)) {
      if (num == -1) {
        for (row = 0; (int)row < info_ptr->splt_palettes_num; row = row + 1) {
          png_free(png_ptr,info_ptr->splt_palettes[(int)row].name);
          png_free(png_ptr,info_ptr->splt_palettes[(int)row].entries);
        }
        png_free(png_ptr,info_ptr->splt_palettes);
        info_ptr->splt_palettes = (png_sPLT_tp)0x0;
        info_ptr->splt_palettes_num = 0;
        info_ptr->valid = info_ptr->valid & 0xffffdfff;
      }
      else {
        png_free(png_ptr,info_ptr->splt_palettes[num].name);
        png_free(png_ptr,info_ptr->splt_palettes[num].entries);
        info_ptr->splt_palettes[num].name = (png_charp)0x0;
        info_ptr->splt_palettes[num].entries = (png_sPLT_entryp)0x0;
      }
    }
    if ((info_ptr->unknown_chunks != (png_unknown_chunkp)0x0) &&
       ((mask & 0x200 & info_ptr->free_me) != 0)) {
      if (num == -1) {
        for (local_30 = 0; local_30 < info_ptr->unknown_chunks_num; local_30 = local_30 + 1) {
          png_free(png_ptr,info_ptr->unknown_chunks[local_30].data);
        }
        png_free(png_ptr,info_ptr->unknown_chunks);
        info_ptr->unknown_chunks = (png_unknown_chunkp)0x0;
        info_ptr->unknown_chunks_num = 0;
      }
      else {
        png_free(png_ptr,info_ptr->unknown_chunks[num].data);
        info_ptr->unknown_chunks[num].data = (png_byte *)0x0;
      }
    }
    if ((mask & 0x8000 & info_ptr->free_me) != 0) {
      if (info_ptr->eXIf_buf != (png_bytep)0x0) {
        png_free(png_ptr,info_ptr->eXIf_buf);
        info_ptr->eXIf_buf = (png_bytep)0x0;
      }
      if (info_ptr->exif != (png_bytep)0x0) {
        png_free(png_ptr,info_ptr->exif);
        info_ptr->exif = (png_bytep)0x0;
      }
      info_ptr->valid = info_ptr->valid & 0xfffeffff;
    }
    if ((mask & 8 & info_ptr->free_me) != 0) {
      png_free(png_ptr,info_ptr->hist);
      info_ptr->hist = (png_uint_16p)0x0;
      info_ptr->valid = info_ptr->valid & 0xffffffbf;
    }
    if ((mask & 0x1000 & info_ptr->free_me) != 0) {
      png_free(png_ptr,info_ptr->palette);
      info_ptr->palette = (png_colorp)0x0;
      info_ptr->valid = info_ptr->valid & 0xfffffff7;
      info_ptr->num_palette = 0;
    }
    if ((mask & 0x40 & info_ptr->free_me) != 0) {
      if (info_ptr->row_pointers != (png_bytepp)0x0) {
        for (local_34 = 0; local_34 < info_ptr->height; local_34 = local_34 + 1) {
          png_free(png_ptr,info_ptr->row_pointers[local_34]);
        }
        png_free(png_ptr,info_ptr->row_pointers);
        info_ptr->row_pointers = (png_bytepp)0x0;
      }
      info_ptr->valid = info_ptr->valid & 0xffff7fff;
    }
    i = mask;
    if (num != -1) {
      i = mask & 0xffffbddf;
    }
    info_ptr->free_me = (i ^ 0xffffffffU) & info_ptr->free_me;
  }
  return;
}

Assistant:

void PNGAPI
png_free_data(png_const_structrp png_ptr, png_inforp info_ptr, png_uint_32 mask,
    int num)
{
   png_debug(1, "in png_free_data");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

#ifdef PNG_TEXT_SUPPORTED
   /* Free text item num or (if num == -1) all text items */
   if (info_ptr->text != NULL &&
       ((mask & PNG_FREE_TEXT) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
         png_free(png_ptr, info_ptr->text[num].key);
         info_ptr->text[num].key = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->num_text; i++)
            png_free(png_ptr, info_ptr->text[i].key);

         png_free(png_ptr, info_ptr->text);
         info_ptr->text = NULL;
         info_ptr->num_text = 0;
         info_ptr->max_text = 0;
      }
   }
#endif

#ifdef PNG_tRNS_SUPPORTED
   /* Free any tRNS entry */
   if (((mask & PNG_FREE_TRNS) & info_ptr->free_me) != 0)
   {
      info_ptr->valid &= ~PNG_INFO_tRNS;
      png_free(png_ptr, info_ptr->trans_alpha);
      info_ptr->trans_alpha = NULL;
      info_ptr->num_trans = 0;
   }
#endif

#ifdef PNG_sCAL_SUPPORTED
   /* Free any sCAL entry */
   if (((mask & PNG_FREE_SCAL) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->scal_s_width);
      png_free(png_ptr, info_ptr->scal_s_height);
      info_ptr->scal_s_width = NULL;
      info_ptr->scal_s_height = NULL;
      info_ptr->valid &= ~PNG_INFO_sCAL;
   }
#endif

#ifdef PNG_pCAL_SUPPORTED
   /* Free any pCAL entry */
   if (((mask & PNG_FREE_PCAL) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->pcal_purpose);
      png_free(png_ptr, info_ptr->pcal_units);
      info_ptr->pcal_purpose = NULL;
      info_ptr->pcal_units = NULL;

      if (info_ptr->pcal_params != NULL)
         {
            int i;

            for (i = 0; i < info_ptr->pcal_nparams; i++)
               png_free(png_ptr, info_ptr->pcal_params[i]);

            png_free(png_ptr, info_ptr->pcal_params);
            info_ptr->pcal_params = NULL;
         }
      info_ptr->valid &= ~PNG_INFO_pCAL;
   }
#endif

#ifdef PNG_iCCP_SUPPORTED
   /* Free any profile entry */
   if (((mask & PNG_FREE_ICCP) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->iccp_name);
      png_free(png_ptr, info_ptr->iccp_profile);
      info_ptr->iccp_name = NULL;
      info_ptr->iccp_profile = NULL;
      info_ptr->valid &= ~PNG_INFO_iCCP;
   }
#endif

#ifdef PNG_sPLT_SUPPORTED
   /* Free a given sPLT entry, or (if num == -1) all sPLT entries */
   if (info_ptr->splt_palettes != NULL &&
       ((mask & PNG_FREE_SPLT) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
         png_free(png_ptr, info_ptr->splt_palettes[num].name);
         png_free(png_ptr, info_ptr->splt_palettes[num].entries);
         info_ptr->splt_palettes[num].name = NULL;
         info_ptr->splt_palettes[num].entries = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->splt_palettes_num; i++)
         {
            png_free(png_ptr, info_ptr->splt_palettes[i].name);
            png_free(png_ptr, info_ptr->splt_palettes[i].entries);
         }

         png_free(png_ptr, info_ptr->splt_palettes);
         info_ptr->splt_palettes = NULL;
         info_ptr->splt_palettes_num = 0;
         info_ptr->valid &= ~PNG_INFO_sPLT;
      }
   }
#endif

#ifdef PNG_STORE_UNKNOWN_CHUNKS_SUPPORTED
   if (info_ptr->unknown_chunks != NULL &&
       ((mask & PNG_FREE_UNKN) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
          png_free(png_ptr, info_ptr->unknown_chunks[num].data);
          info_ptr->unknown_chunks[num].data = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->unknown_chunks_num; i++)
            png_free(png_ptr, info_ptr->unknown_chunks[i].data);

         png_free(png_ptr, info_ptr->unknown_chunks);
         info_ptr->unknown_chunks = NULL;
         info_ptr->unknown_chunks_num = 0;
      }
   }
#endif

#ifdef PNG_eXIf_SUPPORTED
   /* Free any eXIf entry */
   if (((mask & PNG_FREE_EXIF) & info_ptr->free_me) != 0)
   {
# ifdef PNG_READ_eXIf_SUPPORTED
      if (info_ptr->eXIf_buf)
      {
         png_free(png_ptr, info_ptr->eXIf_buf);
         info_ptr->eXIf_buf = NULL;
      }
# endif
      if (info_ptr->exif)
      {
         png_free(png_ptr, info_ptr->exif);
         info_ptr->exif = NULL;
      }
      info_ptr->valid &= ~PNG_INFO_eXIf;
   }
#endif

#ifdef PNG_hIST_SUPPORTED
   /* Free any hIST entry */
   if (((mask & PNG_FREE_HIST) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->hist);
      info_ptr->hist = NULL;
      info_ptr->valid &= ~PNG_INFO_hIST;
   }
#endif

   /* Free any PLTE entry that was internally allocated */
   if (((mask & PNG_FREE_PLTE) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->palette);
      info_ptr->palette = NULL;
      info_ptr->valid &= ~PNG_INFO_PLTE;
      info_ptr->num_palette = 0;
   }

#ifdef PNG_INFO_IMAGE_SUPPORTED
   /* Free any image bits attached to the info structure */
   if (((mask & PNG_FREE_ROWS) & info_ptr->free_me) != 0)
   {
      if (info_ptr->row_pointers != NULL)
      {
         png_uint_32 row;
         for (row = 0; row < info_ptr->height; row++)
            png_free(png_ptr, info_ptr->row_pointers[row]);

         png_free(png_ptr, info_ptr->row_pointers);
         info_ptr->row_pointers = NULL;
      }
      info_ptr->valid &= ~PNG_INFO_IDAT;
   }
#endif

   if (num != -1)
      mask &= ~PNG_FREE_MUL;

   info_ptr->free_me &= ~mask;
}